

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

_Bool get_phys_addr_aarch64
                (CPUARMState_conflict *env,target_ulong address,MMUAccessType access_type,
                ARMMMUIdx mmu_idx,hwaddr *phys_ptr,MemTxAttrs *attrs,int *prot,
                target_ulong *page_size,ARMMMUFaultInfo_conflict1 *fi,ARMCacheAttrs *cacheattrs)

{
  CPUState *cs;
  uc_struct_conflict2 *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  ARMMMUIdx mmu_idx_00;
  _Bool _Var4;
  MemTxAttrs MVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ARMCacheAttrs *cacheattrs_00;
  long lVar8;
  TCR *pTVar9;
  target_ulong tVar10;
  byte bVar11;
  byte bVar12;
  uint uVar13;
  ARMFaultType AVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  int ap;
  ulong uVar20;
  uint uVar21;
  ARMCacheAttrs AVar22;
  uint uVar23;
  byte bVar24;
  char *file;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  CPUARMState_conflict *env_00;
  undefined4 uVar28;
  bool bVar29;
  ushort local_78;
  hwaddr ipa;
  undefined8 local_58;
  CPUState *local_50;
  ulong local_48;
  uint local_3c;
  ARMCacheAttrs cacheattrs2;
  int s2_prot;
  
  env_00 = (CPUARMState_conflict *)(ulong)mmu_idx;
  puVar1 = env->uc;
  if ((mmu_idx < ARMMMUIdx_E2) && ((0xd0000U >> (mmu_idx & 0x1f) & 1) != 0)) {
    if ((env->features & 0x100000000) != 0) {
      cacheattrs2 = (ARMCacheAttrs)0x0;
      if (mmu_idx == ARMMMUIdx_E10_0) {
        mmu_idx = ARMMMUIdx_Stage1_E0;
      }
      else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
        mmu_idx = ARMMMUIdx_Stage1_E1_PAN;
      }
      else if (mmu_idx == ARMMMUIdx_E10_1) {
        mmu_idx = ARMMMUIdx_Stage1_E1;
      }
      _Var4 = get_phys_addr_aarch64
                        (env,address,access_type,mmu_idx,&ipa,attrs,prot,page_size,fi,cacheattrs);
      if (!_Var4) {
        if ((env->features & 0x200) == 0) {
          if (((env->cp15).hcr_el2 & 0x1001) != 0) {
LAB_0061aa8c:
            cacheattrs_00 = &cacheattrs2;
            if (cacheattrs == (ARMCacheAttrs *)0x0) {
              cacheattrs_00 = (ARMCacheAttrs *)0x0;
            }
            _Var4 = get_phys_addr_lpae(env,CONCAT44(ipa._4_4_,(uint)ipa),access_type,
                                       ARMMMUIdx_Stage2,phys_ptr,attrs,&s2_prot,page_size,fi,
                                       cacheattrs_00);
            fi->s2addr = CONCAT44(ipa._4_4_,(uint)ipa);
            *prot = *prot & s2_prot;
            if (cacheattrs != (ARMCacheAttrs *)0x0 && !_Var4) {
              if (((env->cp15).hcr_el2 & 0x1000) != 0) {
                *(ushort *)cacheattrs = SUB42(*cacheattrs,0) & 0xfc00 | 0xff;
              }
              AVar22 = *cacheattrs;
              uVar18 = (uint)AVar22 >> 4 & 0xf;
              bVar12 = (byte)uVar18;
              uVar17 = (uint)cacheattrs2 >> 4 & 0xf;
              uVar16 = (uint)AVar22 >> 8 & 3;
              uVar21 = 0x200;
              if ((uVar16 != 2) && (uVar26 = (uint)cacheattrs2 >> 8 & 3, uVar26 != 2)) {
                uVar21 = 0;
                if (uVar26 == 3) {
                  uVar21 = 0x300;
                }
                if (uVar16 == 3) {
                  uVar21 = 0x300;
                }
              }
              uVar16 = (uint)AVar22 & 0xf;
              bVar11 = (byte)uVar16;
              uVar26 = (uint)cacheattrs2 & 0xf;
              if (uVar17 == 0 || uVar18 == 0) {
                AVar22 = (ARMCacheAttrs)0x200;
                if ((uVar26 != 0 && uVar16 != 0) &&
                   (AVar22 = (ARMCacheAttrs)0x204, uVar26 != 4 && uVar16 != 4)) {
                  AVar22 = (ARMCacheAttrs)((uint)(uVar26 != 8 && uVar16 != 8) * 4 + 0x208);
                }
              }
              else {
                bVar24 = 4;
                if (((uVar17 != 4 && uVar18 != 4) && (bVar24 = bVar12, (bVar12 >> 2 & 1) != 0)) &&
                   (((uint)cacheattrs2 & 0xc0) == 0x80)) {
                  bVar24 = bVar12 & 3 | 8;
                }
                bVar12 = 4;
                if (((uVar26 != 4 && uVar16 != 4) && (bVar12 = bVar11, (uVar16 >> 2 & 1) != 0)) &&
                   (((uint)cacheattrs2 & 0xc) == 8)) {
                  bVar12 = bVar11 & 3 | 8;
                }
                bVar12 = bVar12 | bVar24 << 4;
                AVar22 = (ARMCacheAttrs)0x244;
                if (bVar12 != 0x44) {
                  AVar22 = (ARMCacheAttrs)(uVar21 | bVar12);
                }
              }
              *cacheattrs = AVar22;
              return _Var4;
            }
            return _Var4;
          }
        }
        else if ((~(env->v7m).mpu_ctrl[0] & 3) == 0) goto LAB_0061aa8c;
      }
      *phys_ptr = CONCAT44(ipa._4_4_,(uint)ipa);
      return _Var4;
    }
    if (mmu_idx == ARMMMUIdx_E10_0) {
      env_00 = (CPUARMState_conflict *)0x20;
    }
    else if (mmu_idx == ARMMMUIdx_E10_1_PAN) {
      env_00 = (CPUARMState_conflict *)0x22;
    }
    else if (mmu_idx == ARMMMUIdx_E10_1) {
      env_00 = (CPUARMState_conflict *)0x21;
    }
  }
  mmu_idx_00 = (ARMMMUIdx)env_00;
  uVar21 = mmu_idx_00 - ARMMMUIdx_E10_0;
  uVar25 = (ulong)uVar21;
  if ((0x37 < uVar21) || ((0xff000000070fffU >> (uVar25 & 0x3f) & 1) == 0)) {
LAB_0061bd4b:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
    ;
    iVar19 = 0x37c;
    goto LAB_0061bd57;
  }
  MVar5 = (MemTxAttrs)((uint)*attrs & 0xfffffffd | *(uint *)(&DAT_00d7d738 + (ulong)uVar21 * 4));
  *attrs = MVar5;
  if (uVar21 < 0x37) {
    uVar18 = 4;
    if ((0x55000000010082U >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0061a796;
    if ((0xdUL >> (uVar25 & 0x3f) & 1) == 0) goto LAB_0061ace0;
LAB_0061bd5e:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
    ;
    iVar19 = 0x2386;
LAB_0061bd57:
    g_assertion_message_expr(file,iVar19,(char *)0x0);
  }
LAB_0061ace0:
  uVar18 = 0;
LAB_0061a796:
  *attrs = (MemTxAttrs)((uint)MVar5 & 0xfffffffb | uVar18);
  if ((mmu_idx_00 != ARMMMUIdx_Stage2 && address < 0x2000000) && ((env->features & 0x8000000) == 0))
  {
    uVar6 = regime_el(env,mmu_idx_00);
    address = address + (&(env->cp15).field_38.fcseidr_ns)[uVar6 == 3];
  }
  uVar18 = (uint)address;
  if ((env->features & 0x80) == 0) {
    _Var4 = regime_translation_disabled(env,mmu_idx_00);
    if (_Var4) {
      if (mmu_idx_00 == ARMMMUIdx_Stage2) goto LAB_0061b11f;
      uVar6 = regime_el(env,mmu_idx_00);
      uVar25 = env->features;
      uVar21 = (uint)uVar25 & 0x10000000;
      if (uVar6 == 3) {
        uVar15 = (ulong)(uVar21 >> 0x1c);
      }
      else {
        uVar18 = 0;
        if ((uVar25 & 0x200000000) == 0) {
          uVar18 = uVar21 >> 0x1c;
        }
        if ((~uVar25 & 0x210000000) == 0) {
          uVar18 = (uint)(env->cp15).scr_el3 >> 10;
        }
        uVar15 = (ulong)uVar18;
        if (((uVar6 != 2) && ((uVar25 >> 0x20 & 1) != 0)) &&
           (((uVar25 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
          if ((uVar18 & 1) == 0) {
            uVar15 = 0;
          }
          else {
            uVar15 = (env->cp15).hcr_el2 >> 0x1f;
          }
        }
      }
      if ((uVar15 & 1) == 0) {
        bVar29 = true;
      }
      else {
        uVar25 = (ulong)((uint)env[1].xregs[0x14] & 0xf);
        if (5 < uVar25) {
          __assert_fail("parange < ARRAY_SIZE(pamax_map)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/internals.h"
                        ,0xf7,"unsigned int arm_pamax(ARMCPU *)");
        }
        uVar15 = (env->cp15).tcr_el[uVar6].raw_tcr;
        uVar21 = (uint)(uVar15 >> 0x20);
        if (mmu_idx_00 < 0x23) {
          if ((0x703ef0000U >> ((ulong)env_00 & 0x3f) & 1) == 0) {
            uVar18 = 0;
            if (env_00 != (CPUARMState_conflict *)0x1b) goto LAB_0061b562;
          }
          else {
            uVar18 = uVar21 >> 5;
          }
        }
        else {
LAB_0061b562:
          uVar18 = ((uint)(uVar15 >> 0x14) & 1) * 3;
        }
        if (access_type == MMU_INST_FETCH) {
          if (mmu_idx_00 < 0x23) {
            if ((0x703ef0000U >> ((ulong)env_00 & 0x3f) & 1) == 0) {
              uVar21 = 0;
              if (env_00 != (CPUARMState_conflict *)0x1b) goto LAB_0061b731;
            }
            else {
              uVar21 = uVar21 >> 0x13;
            }
          }
          else {
LAB_0061b731:
            uVar21 = ((uint)uVar15 >> 0x1d & 1) * 3;
          }
          uVar18 = uVar18 & ~uVar21;
        }
        iVar19 = ((uint)((uVar18 >> ((uint)(address >> 0x37) & 1) & 1) == 0) * 8 + 0x37) -
                 *(int *)(arm_pamax_pamax_map + uVar25 * 4);
        if (iVar19 < 0) {
          __assert_fail("start >= 0 && length > 0 && length <= 64 - start",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                        ,0x158,"uint64_t extract64(uint64_t, int, int)");
        }
        bVar29 = (address >> ((byte)*(int *)(arm_pamax_pamax_map + uVar25 * 4) & 0x3f)) <<
                 (~(byte)iVar19 & 0x3f) == 0;
        if (bVar29) {
          address = address & 0xfffffffffffff;
        }
        else {
          fi->type = ARMFault_AddressSize;
          fi->level = 0;
          fi->stage2 = false;
        }
      }
      if (!bVar29) {
        return true;
      }
LAB_0061b11f:
      *phys_ptr = address;
      *prot = 7;
      *page_size = puVar1->init_target_page->mask * -0x100000000 >> 0x20;
      return false;
    }
    uVar6 = regime_el(env,mmu_idx_00);
    if (uVar6 == 2) {
LAB_0061b2d6:
      _Var4 = get_phys_addr_lpae(env,address,access_type,mmu_idx_00,phys_ptr,attrs,prot,page_size,fi
                                 ,cacheattrs);
      return _Var4;
    }
    uVar15 = env->features;
    uVar16 = ((uint)uVar15 & 0x10000000) >> 0x1c;
    uVar20 = (ulong)uVar16;
    if (uVar6 != 3) {
      uVar17 = 0;
      if ((uVar15 & 0x200000000) == 0) {
        uVar17 = uVar16;
      }
      if ((~uVar15 & 0x210000000) == 0) {
        uVar17 = (uint)(env->cp15).scr_el3 >> 10;
      }
      uVar20 = (ulong)uVar17;
      if (((uVar15 >> 0x20 & 1) != 0) &&
         (((uVar15 & 0x200000000) == 0 || (((env->cp15).scr_el3 & 1) != 0)))) {
        if ((uVar17 & 1) == 0) {
          uVar20 = 0;
        }
        else {
          uVar20 = (env->cp15).hcr_el2 >> 0x1f;
        }
      }
    }
    if ((uVar20 & 1) != 0) goto LAB_0061b2d6;
    if (((uint)uVar15 >> 0x1a & 1) != 0) {
      if (mmu_idx_00 == ARMMMUIdx_Stage2) {
        pTVar9 = &(env->cp15).vtcr_el2;
      }
      else {
        uVar6 = regime_el(env,mmu_idx_00);
        pTVar9 = (env->cp15).tcr_el + uVar6;
      }
      if ((pTVar9->raw_tcr & 0x80000000) != 0) goto LAB_0061b2d6;
    }
    uVar6 = regime_el(env,mmu_idx_00);
    cs = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
    if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar6 * 8 + -0x26) & 0x80) != 0) {
      _Var4 = get_level1_table_address(env,mmu_idx_00,(uint32_t *)&ipa,uVar18);
      AVar14 = ARMFault_Translation;
      if (!_Var4) {
        uVar16 = 0;
        iVar19 = 1;
        goto LAB_0061b492;
      }
      if ((0x37 < uVar21) || ((0xff000000070fffU >> (uVar25 & 0x3f) & 1) == 0)) goto LAB_0061bd4b;
      uVar6 = arm_ldl_ptw(cs,(ulong)(uint)ipa,(0xf0000000000780U >> (uVar25 & 0x3f) & 1) != 0,
                          mmu_idx_00,fi);
      if (fi->type != ARMFault_None) {
        uVar16 = 0;
        iVar19 = 1;
        goto LAB_0061b494;
      }
      iVar19 = 1;
      uVar17 = uVar6 & 3;
      if ((uVar17 == 0) || ((uVar17 == 3 && ((env->features & 0x2000000) == 0)))) {
        uVar16 = 0;
LAB_0061b77d:
        AVar14 = ARMFault_Translation;
      }
      else {
        uVar26 = uVar6 >> 5 & 0xf;
        local_48 = (ulong)uVar26;
        uVar16 = 0;
        if ((uVar6 >> 0x12 & 1) == 0) {
          uVar16 = uVar26;
        }
        if (uVar17 == 1) {
          uVar16 = uVar26;
        }
        uVar15 = (ulong)uVar16;
        local_58 = CONCAT44(local_58._4_4_,uVar6) & 0xffffffff00000003;
        local_50 = cs;
        uVar7 = regime_el(env,mmu_idx_00);
        uVar26 = *(uint32_t *)((long)((env->cp15).tcr_el + 5) + ((ulong)(uVar7 != 1) * 2 + 2) * 4);
        iVar19 = (uVar17 == 1) + 1;
        uVar17 = uVar26 >> (sbyte)(uVar16 * 2);
        if ((uVar26 >> uVar16 * 2 & 1) == 0) {
          AVar14 = ARMFault_Domain;
        }
        else {
          if ((int)local_58 == 1) {
            local_48 = CONCAT44(local_48._4_4_,uVar17);
            local_3c = 0;
            if (((uint)env->features >> 0x19 & 1) != 0) {
              local_3c = uVar6 >> 2 & 1;
            }
            ipa._0_4_ = (uint)(address >> 10) & 0x3fc | uVar6 & 0xfffffc00;
            local_58 = uVar15;
            if ((0x37 < uVar21) || ((0xff000000070fffU >> (uVar25 & 0x3f) & 1) == 0))
            goto LAB_0061bd4b;
            uVar7 = arm_ldl_ptw(local_50,(ulong)(uint)ipa,
                                (0xf0000000000780U >> (uVar25 & 0x3f) & 1) != 0,mmu_idx_00,fi);
            uVar16 = (uint)local_58;
            if (fi->type != ARMFault_None) goto LAB_0061b494;
            uVar26 = uVar6 >> 3;
            uVar27 = uVar7 >> 7 & 4 | uVar7 >> 4 & 3;
            if ((uVar7 & 3) - 2 < 2) {
              uVar18 = uVar18 & 0xfff | uVar7 & 0xfffff000;
              uVar23 = uVar7 & 1;
              *page_size = 0x1000;
            }
            else {
              if ((uVar7 & 3) == 0) goto LAB_0061b77d;
              local_78 = (ushort)address;
              uVar18 = (uint)local_78 | uVar7 & 0xffff0000;
              uVar23 = uVar7 & 0x8000;
              *page_size = 0x10000;
            }
            uVar15 = (ulong)uVar18;
            uVar17 = (uint)local_48;
            uVar18 = local_3c;
          }
          else {
            if ((uVar6 >> 0x12 & 1) == 0) {
              uVar15 = (ulong)(uVar18 & 0xfffff | uVar6 & 0xfff00000);
              tVar10 = 0x100000;
            }
            else {
              uVar15 = local_48 << 0x24 |
                       CONCAT44(uVar6 >> 0x14,uVar18 & 0xffffff | uVar6 & 0xff000000) & 0xfffffffff;
              tVar10 = 0x1000000;
            }
            *page_size = tVar10;
            uVar27 = uVar6 >> 0xd & 4 | uVar6 >> 10 & 3;
            uVar23 = uVar6 & 0x10;
            uVar18 = uVar6 & 1;
            uVar26 = uVar6 >> 0x13;
          }
          if ((uVar17 & 3) == 3) {
            *prot = 7;
            local_48 = uVar15;
            goto LAB_0061bbb4;
          }
          if (uVar18 != 0) {
            if (uVar21 < 0x37) {
              if ((0x55000000010082U >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0061bb0d;
              if ((0xdUL >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0061bd5e;
            }
            uVar23 = 1;
          }
LAB_0061bb0d:
          if ((access_type == MMU_INST_FETCH) && (uVar23 != 0)) {
            AVar14 = ARMFault_Permission;
          }
          else {
            local_48 = uVar15;
            if (((env->features & 0x10) == 0) ||
               (uVar6 = regime_el(env,mmu_idx_00),
               (*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar6 * 8 + -0x25) & 0x20) == 0)) {
              uVar21 = ap_to_rw_prot(env,mmu_idx_00,uVar27,uVar17 & 3);
            }
            else {
              if ((uVar27 & 1) == 0) {
                AVar14 = ARMFault_AccessFlag;
                goto LAB_0061b492;
              }
              uVar21 = simple_ap_to_rw_prot(env_00,uVar27 >> 1,ap);
            }
            uVar18 = uVar21 | 4;
            if (uVar21 == 0) {
              uVar18 = uVar21;
            }
            if (uVar23 != 0) {
              uVar18 = uVar21;
            }
            *prot = uVar18;
            AVar14 = ARMFault_Permission;
            if ((uVar18 >> (access_type & 0x1f) & 1) != 0) {
LAB_0061bbb4:
              if ((uVar26 & 1) != 0) {
                *(byte *)attrs = *(byte *)attrs & 0xfd;
              }
              *phys_ptr = local_48;
              return false;
            }
          }
        }
      }
LAB_0061b492:
      fi->type = AVar14;
LAB_0061b494:
      fi->domain = uVar16;
      fi->level = iVar19;
      return true;
    }
    _Var4 = get_level1_table_address(env,mmu_idx_00,(uint32_t *)&ipa,uVar18);
    AVar14 = ARMFault_Translation;
    if (_Var4) {
      if ((0x37 < uVar21) || ((0xff000000070fffU >> (uVar25 & 0x3f) & 1) == 0)) goto LAB_0061bd4b;
      uVar6 = arm_ldl_ptw(cs,(ulong)(uint)ipa,(0xf0000000000780U >> (uVar25 & 0x3f) & 1) != 0,
                          mmu_idx_00,fi);
      if (fi->type != ARMFault_None) {
        uVar16 = 0;
        iVar19 = 1;
        goto LAB_0061b479;
      }
      uVar16 = uVar6 >> 5 & 0xf;
      local_50 = cs;
      uVar7 = regime_el(env,mmu_idx_00);
      uVar26 = *(uint32_t *)((long)((env->cp15).tcr_el + 5) + ((ulong)(uVar7 != 1) * 2 + 2) * 4) >>
               (char)uVar16 * '\x02';
      iVar19 = 1;
      uVar17 = uVar6 & 3;
      if (uVar17 == 0) goto switchD_0061b8fa_caseD_0;
      if (uVar17 != 2) {
        iVar19 = 2;
      }
      if ((uVar26 & 1) == 0) {
        AVar14 = ARMFault_Domain;
        goto LAB_0061b473;
      }
      if (uVar17 == 2) {
        uVar17 = uVar18 & 0xfffff | uVar6 & 0xfff00000;
        uVar18 = uVar6 >> 10;
        *page_size = 0x100000;
        goto LAB_0061bc1e;
      }
      local_58 = CONCAT44(local_58._4_4_,uVar6) & 0xffffffff00000003;
      bVar29 = uVar17 == 1;
      uVar17 = 0xfffff000;
      if (bVar29) {
        uVar17 = 0xfffffc00;
      }
      uVar27 = 0xffc;
      if (bVar29) {
        uVar27 = 0x3fc;
      }
      ipa._0_4_ = uVar18 >> (bVar29 * '\x02' | 8U) & uVar27 | uVar6 & uVar17;
      if ((0x37 < uVar21) || ((0xff000000070fffU >> (uVar25 & 0x3f) & 1) == 0)) goto LAB_0061bd4b;
      uVar6 = arm_ldl_ptw(local_50,(ulong)(uint)ipa,(0xf0000000000780U >> (uVar25 & 0x3f) & 1) != 0,
                          mmu_idx_00,fi);
      if (fi->type != ARMFault_None) goto LAB_0061b479;
      switch(uVar6 & 3) {
      case 0:
switchD_0061b8fa_caseD_0:
        AVar14 = ARMFault_Translation;
        goto LAB_0061b473;
      case 1:
        uVar17 = uVar18 & 0xffff | uVar6 & 0xffff0000;
        uVar18 = uVar6 >> ((byte)(address >> 0xd) & 6) + 4;
        *page_size = 0x10000;
        break;
      case 2:
        uVar17 = uVar18 & 0xfff | uVar6 & 0xfffff000;
        uVar18 = uVar6 >> ((byte)(uVar18 >> 9) & 6) + 4;
        *page_size = 0x1000;
        break;
      case 3:
        if ((int)local_58 == 1) {
          if ((env->features & 10) == 0) goto switchD_0061b8fa_caseD_0;
          tVar10 = 0x1000;
          uVar27 = 0xfff;
          uVar17 = 0xfffff000;
        }
        else {
          tVar10 = 0x400;
          uVar27 = 0x3ff;
          uVar17 = 0xfffffc00;
        }
        uVar17 = uVar27 & uVar18 | uVar17 & uVar6;
        *page_size = tVar10;
        uVar18 = uVar6 >> 4;
      }
LAB_0061bc1e:
      if (uVar21 < 0x37) {
        bVar12 = 1;
        if ((0x55000000010082U >> (uVar25 & 0x3f) & 1) == 0) {
          if ((0xdUL >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0061bd5e;
          goto LAB_0061bd0b;
        }
      }
      else {
LAB_0061bd0b:
        bVar12 = 0;
      }
      uVar21 = 3;
      if ((uVar26 & 3) != 3) {
        uVar21 = uVar18 & 3;
        switch(uVar21) {
        case 0:
          uVar21 = 0;
          if ((env->features & 0x20) == 0) {
            uVar6 = regime_el(env,mmu_idx_00);
            uVar18 = (uint)(env->cp15).cptr_el[(ulong)uVar6 - 5] & 0x300;
            if (uVar18 == 0x200) {
              uVar21 = 1;
            }
            else if (uVar18 == 0x100) {
              uVar21 = (uint)(bVar12 ^ 1);
            }
          }
          break;
        case 1:
          uVar21 = (uint)(bVar12 ^ 1) + (uint)(bVar12 ^ 1) * 2;
          break;
        case 2:
          uVar21 = (uint)(bVar12 ^ 1) * 2 + 1;
        }
      }
      uVar21 = uVar21 + (uint)(uVar21 != 0) * 4;
      *prot = uVar21;
      if ((uVar21 >> (access_type & 0x1f) & 1) != 0) {
        *phys_ptr = (ulong)uVar17;
        return false;
      }
      AVar14 = ARMFault_Permission;
    }
    else {
      uVar16 = 0;
      iVar19 = 1;
    }
LAB_0061b473:
    fi->type = AVar14;
LAB_0061b479:
    fi->domain = uVar16;
    fi->level = iVar19;
    return true;
  }
  *page_size = puVar1->init_target_page->mask * -0x100000000 >> 0x20;
  uVar15 = env->features;
  if (((uint)uVar15 >> 0x1b & 1) != 0) {
    if ((uVar21 < 0x38) && ((0xff000000070fffU >> (uVar25 & 0x3f) & 1) != 0)) {
      puVar1 = env->uc;
      if (((uVar15 >> 0x25 & 1) != 0) && ((0xf0000000000780U >> ((byte)uVar21 & 0x3f) & 1) == 0)) {
        fi->type = ARMFault_QEMU_SFault;
        *page_size = puVar1->init_target_page->mask * -0x100000000 >> 0x20;
        *phys_ptr = address & 0xffffffff;
        *prot = 0;
        return true;
      }
      _Var4 = pmsav8_mpu_lookup_aarch64
                        (env,uVar18,access_type,mmu_idx_00,phys_ptr,attrs,prot,(_Bool *)&ipa,fi,
                         (uint32_t *)0x0);
      tVar10 = 1;
      if ((char)ipa == '\0') {
        tVar10 = puVar1->init_target_page->mask * -0x100000000 >> 0x20;
      }
      *page_size = tVar10;
      return _Var4;
    }
    goto LAB_0061bd4b;
  }
  if ((uVar15 & 0x20) != 0) {
    puVar1 = env->uc;
    if (uVar21 < 0x37) {
      uVar28 = 0x70f01;
      if ((0x55000000010082U >> (uVar25 & 0x3f) & 1) == 0) {
        if ((0xdUL >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0061bd5e;
        goto LAB_0061b513;
      }
    }
    else {
LAB_0061b513:
      uVar28 = 0;
    }
    *phys_ptr = address & 0xffffffff;
    *page_size = puVar1->init_target_page->mask * -0x100000000 >> 0x20;
    *prot = 0;
    _Var4 = regime_translation_disabled(env,mmu_idx_00);
    if ((!_Var4) && (((uVar18 & 0xfff00000) != 0xe0000000 || ((env->features & 0x200) == 0)))) {
      iVar19 = *(int *)((long)env[1].xregs + 0x1c);
      uVar21 = iVar19 - 1;
      if (0 < iVar19) {
        puVar2 = (env->pmsav7).drbar;
        puVar3 = (env->pmsav7).drsr;
        local_50 = (CPUState *)CONCAT44(local_50._4_4_,uVar28);
        uVar25 = (ulong)uVar21;
        do {
          uVar21 = puVar3[uVar25];
          uVar16 = uVar21 >> 1 & 0x1f;
          if (uVar16 != 0 && (uVar21 & 1) != 0) {
            uVar17 = uVar16 + 1;
            uVar26 = puVar2[uVar25];
            uVar27 = ~(uint)(-1L << (sbyte)uVar17);
            if ((uVar26 & uVar27) == 0) {
              if ((uVar18 < uVar26) || (uVar26 + uVar27 < uVar18)) {
                lVar8 = puVar1->init_target_page->mask;
                uVar15 = (ulong)((uint)lVar8 & uVar18);
                if ((uVar15 <= ((ulong)uVar27 + (ulong)uVar26) - 1) &&
                   ((ulong)uVar26 <= ((lVar8 * -0x100000000 >> 0x20) + uVar15) - 1)) {
                  *page_size = 1;
                }
              }
              else {
                if (uVar16 < 7) {
                  uVar16 = 0;
                }
                else {
                  uVar17 = uVar16 - 2;
                  uVar23 = uVar18 - uVar26 >> ((byte)uVar17 & 0x1f) & 7;
                  uVar16 = (uVar21 >> (sbyte)uVar23) >> 8 & 1;
                  uVar26 = uVar16 * 3;
                  uVar27 = 2;
                  do {
                    if ((uint)puVar1->init_target_page->bits <= uVar17) break;
                    uVar13 = -uVar27 & uVar23 | 8;
                    if ((int)(0x20 - uVar13) < (int)uVar27) {
                      __assert_fail("start >= 0 && length > 0 && length <= 32 - start",
                                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/qemu/bitops.h"
                                    ,0x11f,"uint32_t extract32(uint32_t, int, int)");
                    }
                    bVar12 = -(byte)uVar27;
                    uVar13 = ((uVar21 >> (sbyte)uVar13) << (bVar12 & 0x1f)) >> (bVar12 & 0x1f);
                    uVar17 = uVar17 + (uVar26 == uVar13);
                    if (uVar26 != uVar13) break;
                    uVar26 = uVar26 | uVar26 << ((byte)uVar27 & 0x1f);
                    bVar29 = uVar27 < 5;
                    uVar27 = uVar27 * 2;
                  } while (bVar29);
                }
                if ((char)uVar16 == '\0') {
                  iVar19 = 1;
                  if (uVar17 < (uint)puVar1->init_target_page->bits) {
                    *page_size = 1L << ((byte)uVar17 & 0x3f);
                  }
                  goto LAB_0061b0ff;
                }
              }
            }
          }
          bVar29 = 0 < (long)uVar25;
          uVar25 = uVar25 - 1;
        } while (bVar29);
        uVar25 = 0xffffffff;
        iVar19 = 0;
LAB_0061b0ff:
        uVar21 = (uint)uVar25;
      }
      if (iVar19 == 0) {
        _Var4 = pmsav7_use_background_region
                          ((ARMCPU_conflict1 *)(env[-4].vfp.zregs[0x17].d + 0x14),mmu_idx_00,
                           SUB41(uVar28,0));
        if (!_Var4) {
          fi->type = ARMFault_Background;
          return true;
        }
        if ((env->features & 0x200) != 0) goto LAB_0061b247;
        *prot = 3;
        goto joined_r0x0061ac9c;
      }
      uVar21 = (env->pmsav7).dracr[(int)uVar21];
      uVar17 = uVar21 >> 8 & 7;
      uVar16 = (uint)env->features;
      if (SUB41(uVar28,0) == false) {
        if (uVar17 - 1 < 3) goto switchD_0061b1fa_caseD_3;
        if (uVar17 - 5 < 2) goto switchD_0061b1fa_caseD_2;
        if (uVar17 == 7) goto switchD_0061b1fa_caseD_7;
      }
      else {
        switch(uVar17) {
        case 3:
switchD_0061b1fa_caseD_3:
          *(byte *)prot = (byte)*prot | 2;
        case 2:
        case 6:
switchD_0061b1fa_caseD_2:
          *(byte *)prot = (byte)*prot | 5;
          break;
        case 7:
switchD_0061b1fa_caseD_7:
          if ((uVar16 >> 9 & 1) != 0) goto switchD_0061b1fa_caseD_2;
        }
      }
      if (0xdfffffff < uVar18 && (uVar16 >> 9 & 1) != 0 || (uVar21 >> 0xc & 1) != 0) {
        uVar21 = *prot & 0xfffffffb;
LAB_0061b58b:
        *prot = uVar21;
      }
LAB_0061b58e:
      fi->type = ARMFault_Permission;
      fi->level = 1;
      return ((uint)*prot >> (access_type & 0x1f) & 1) == 0;
    }
    if ((env->features & 0x200) == 0) {
      *prot = 3;
joined_r0x0061ac9c:
      if (uVar18 < 0xf0000000) {
        uVar21 = 7;
        if ((int)uVar18 < 0) goto LAB_0061b58e;
      }
      else {
        uVar6 = regime_el(env,mmu_idx_00);
        if ((*(byte *)((long)(env->cp15).cptr_el + (ulong)uVar6 * 8 + -0x27) & 0x20) == 0)
        goto LAB_0061b58e;
        uVar21 = *prot | 4;
      }
    }
    else {
LAB_0061b247:
      uVar21 = 7;
      if (((((0x3fffffff < uVar18 + 0xa0000000) && (0x1fffffff < uVar18)) &&
           (uVar16 = uVar18 & 0xe0000000, uVar16 != 0x20000000)) &&
          ((uVar21 = 3, uVar18 < 0xe0000000 && (uVar16 != 0xc0000000)))) &&
         (((int)uVar18 < 0x40000000 && (uVar16 != 0xa0000000)))) goto LAB_0061b58e;
    }
    goto LAB_0061b58b;
  }
  if (uVar21 < 0x37) {
    bVar12 = 1;
    if ((0x55000000010082U >> (uVar25 & 0x3f) & 1) == 0) {
      if ((0xdUL >> (uVar25 & 0x3f) & 1) != 0) goto LAB_0061bd5e;
      goto LAB_0061b4fc;
    }
  }
  else {
LAB_0061b4fc:
    bVar12 = 0;
  }
  _Var4 = regime_translation_disabled(env,mmu_idx_00);
  *phys_ptr = address & 0xffffffff;
  if (_Var4) {
    *prot = 7;
    return false;
  }
  lVar8 = 0;
  do {
    uVar21 = (env->cp15).c6_region[lVar8 + 7];
    if (((uVar21 & 1) != 0) && (((uVar21 ^ uVar18) >> ((byte)uVar21 >> 1 & 0x1f) & 0xfffffffe) == 0)
       ) {
      iVar19 = (int)lVar8 + 7;
      goto LAB_0061b150;
    }
    lVar8 = lVar8 + -1;
  } while (lVar8 != -8);
  iVar19 = -1;
LAB_0061b150:
  if (iVar19 < 0) {
    fi->type = ARMFault_Background;
    return true;
  }
  uVar21 = (env->cp15).c6_region[(ulong)(access_type == MMU_INST_FETCH) - 0x12] >>
           ((byte)(iVar19 << 2) & 0x1f) & 0xf;
  switch(uVar21) {
  default:
    goto switchD_0061b187_caseD_0;
  case 1:
    uVar21 = 3;
    goto LAB_0061b5cf;
  case 2:
    uVar21 = (uint)(bVar12 ^ 1) * 2 + 1;
    break;
  case 3:
    break;
  case 5:
    uVar21 = 1;
LAB_0061b5cf:
    if (bVar12 != 0) {
switchD_0061b187_caseD_0:
      fi->type = ARMFault_Permission;
      fi->level = 1;
      return true;
    }
    break;
  case 6:
    uVar21 = 1;
  }
  *prot = uVar21 | 4;
  return false;
}

Assistant:

bool get_phys_addr(CPUARMState *env, target_ulong address,
                   MMUAccessType access_type, ARMMMUIdx mmu_idx,
                   hwaddr *phys_ptr, MemTxAttrs *attrs, int *prot,
                   target_ulong *page_size,
                   ARMMMUFaultInfo *fi, ARMCacheAttrs *cacheattrs)
{
    struct uc_struct *uc = env->uc;
    if (mmu_idx == ARMMMUIdx_E10_0 ||
        mmu_idx == ARMMMUIdx_E10_1 ||
        mmu_idx == ARMMMUIdx_E10_1_PAN) {
        /* Call ourselves recursively to do the stage 1 and then stage 2
         * translations.
         */
        if (arm_feature(env, ARM_FEATURE_EL2)) {
            hwaddr ipa;
            int s2_prot;
            int ret;
            ARMCacheAttrs cacheattrs2 = { 0 };

            ret = get_phys_addr(env, address, access_type,
                                stage_1_mmu_idx(mmu_idx), &ipa, attrs,
                                prot, page_size, fi, cacheattrs);

            /* If S1 fails or S2 is disabled, return early.  */
            if (ret || regime_translation_disabled(env, ARMMMUIdx_Stage2)) {
                *phys_ptr = ipa;
                return ret;
            }

            /* S1 is done. Now do S2 translation.  */
            ret = get_phys_addr_lpae(env, ipa, access_type, ARMMMUIdx_Stage2,
                                     phys_ptr, attrs, &s2_prot,
                                     page_size, fi,
                                     cacheattrs != NULL ? &cacheattrs2 : NULL);
            fi->s2addr = ipa;
            /* Combine the S1 and S2 perms.  */
            *prot &= s2_prot;

            /* Combine the S1 and S2 cache attributes, if needed */
            if (!ret && cacheattrs != NULL) {
                if (env->cp15.hcr_el2 & HCR_DC) {
                    /*
                     * HCR.DC forces the first stage attributes to
                     *  Normal Non-Shareable,
                     *  Inner Write-Back Read-Allocate Write-Allocate,
                     *  Outer Write-Back Read-Allocate Write-Allocate.
                     */
                    cacheattrs->attrs = 0xff;
                    cacheattrs->shareability = 0;
                }
                *cacheattrs = combine_cacheattrs(*cacheattrs, cacheattrs2);
            }

            return ret;
        } else {
            /*
             * For non-EL2 CPUs a stage1+stage2 translation is just stage 1.
             */
            mmu_idx = stage_1_mmu_idx(mmu_idx);
        }
    }

    /* The page table entries may downgrade secure to non-secure, but
     * cannot upgrade an non-secure translation regime's attributes
     * to secure.
     */
    attrs->secure = regime_is_secure(env, mmu_idx);
    attrs->user = regime_is_user(env, mmu_idx);

    /* Fast Context Switch Extension. This doesn't exist at all in v8.
     * In v7 and earlier it affects all stage 1 translations.
     */
    if (address < 0x02000000 && mmu_idx != ARMMMUIdx_Stage2
        && !arm_feature(env, ARM_FEATURE_V8)) {
        if (regime_el(env, mmu_idx) == 3) {
            address += env->cp15.fcseidr_s;
        } else {
            address += env->cp15.fcseidr_ns;
        }
    }

    if (arm_feature(env, ARM_FEATURE_PMSA)) {
        bool ret;
        *page_size = TARGET_PAGE_SIZE;

        if (arm_feature(env, ARM_FEATURE_V8)) {
            /* PMSAv8 */
            ret = get_phys_addr_pmsav8(env, address, access_type, mmu_idx,
                                       phys_ptr, attrs, prot, page_size, fi);
        } else if (arm_feature(env, ARM_FEATURE_V7)) {
            /* PMSAv7 */
            ret = get_phys_addr_pmsav7(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, page_size, fi);
        } else {
            /* Pre-v7 MPU */
            ret = get_phys_addr_pmsav5(env, address, access_type, mmu_idx,
                                       phys_ptr, prot, fi);
        }
        qemu_log_mask(CPU_LOG_MMU, "PMSA MPU lookup for %s at 0x%08" PRIx32
                      " mmu_idx %u -> %s (prot %c%c%c)\n",
                      access_type == MMU_DATA_LOAD ? "reading" :
                      (access_type == MMU_DATA_STORE ? "writing" : "execute"),
                      (uint32_t)address, mmu_idx,
                      ret ? "Miss" : "Hit",
                      *prot & PAGE_READ ? 'r' : '-',
                      *prot & PAGE_WRITE ? 'w' : '-',
                      *prot & PAGE_EXEC ? 'x' : '-');

        return ret;
    }

    /* Definitely a real MMU, not an MPU */

    if (regime_translation_disabled(env, mmu_idx)) {
        /*
         * MMU disabled.  S1 addresses within aa64 translation regimes are
         * still checked for bounds -- see AArch64.TranslateAddressS1Off.
         */
        if (mmu_idx != ARMMMUIdx_Stage2) {
            int r_el = regime_el(env, mmu_idx);
            if (arm_el_is_aa64(env, r_el)) {
                int pamax = arm_pamax(env_archcpu(env));
                uint64_t tcr = env->cp15.tcr_el[r_el].raw_tcr;
                int addrtop, tbi;

                tbi = aa64_va_parameter_tbi(tcr, mmu_idx);
                if (access_type == MMU_INST_FETCH) {
                    tbi &= ~aa64_va_parameter_tbid(tcr, mmu_idx);
                }
                tbi = (tbi >> extract64(address, 55, 1)) & 1;
                addrtop = (tbi ? 55 : 63);

                if (extract64(address, pamax, addrtop - pamax + 1) != 0) {
                    fi->type = ARMFault_AddressSize;
                    fi->level = 0;
                    fi->stage2 = false;
                    return 1;
                }

                /*
                 * When TBI is disabled, we've just validated that all of the
                 * bits above PAMax are zero, so logically we only need to
                 * clear the top byte for TBI.  But it's clearer to follow
                 * the pseudocode set of addrdesc.paddress.
                 */
                address = extract64(address, 0, 52);
            }
        }
        *phys_ptr = address;
        *prot = PAGE_READ | PAGE_WRITE | PAGE_EXEC;
        *page_size = TARGET_PAGE_SIZE;
        return 0;
    }

    if (regime_using_lpae_format(env, mmu_idx)) {
        return get_phys_addr_lpae(env, address, access_type, mmu_idx,
                                  phys_ptr, attrs, prot, page_size,
                                  fi, cacheattrs);
    } else if (regime_sctlr(env, mmu_idx) & SCTLR_XP) {
        return get_phys_addr_v6(env, address, access_type, mmu_idx,
                                phys_ptr, attrs, prot, page_size, fi);
    } else {
        return get_phys_addr_v5(env, address, access_type, mmu_idx,
                                    phys_ptr, prot, page_size, fi);
    }
}